

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cpp
# Opt level: O3

IdSet * jsonnet::internal::static_analysis
                  (IdSet *__return_storage_ptr__,AST *ast_,bool in_object,IdSet *vars)

{
  _Rb_tree_header *p_Var1;
  Identifier **__v;
  pointer *pppIVar2;
  size_type *__v_00;
  _Base_ptr p_Var3;
  _Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> __last;
  unsigned_long uVar4;
  Identifier *pIVar5;
  AST *pAVar6;
  size_type sVar7;
  Identifier *pIVar8;
  _func_int **pp_Var9;
  iterator __position;
  bool bVar10;
  long lVar11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  StaticError *pSVar14;
  ostream *poVar15;
  undefined7 in_register_00000011;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  undefined4 uVar18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  Field *field;
  _Rb_tree_header *p_Var21;
  _Base_ptr *pp_Var22;
  ArgParam *arg;
  unsigned_long uVar23;
  size_type sVar24;
  _func_int **pp_Var25;
  pair<std::_Rb_tree_iterator<const_jsonnet::internal::Identifier_*>,_std::_Rb_tree_iterator<const_jsonnet::internal::Identifier_*>_>
  pVar26;
  IdSet new_vars;
  IdSet params;
  IdSet fv;
  undefined1 local_108 [32];
  _Base_ptr local_e8;
  size_t local_e0;
  _Rb_tree_node_base *local_d8;
  undefined4 local_cc;
  _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *local_c8;
  undefined1 local_c0 [32];
  _Base_ptr local_a0;
  size_t local_98;
  undefined1 local_90 [48];
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar18 = (undefined4)CONCAT71(in_register_00000011,in_object);
  local_d8 = (_Rb_tree_node_base *)__return_storage_ptr__;
  switch(ast_->type) {
  case AST_APPLY:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Apply::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<Apply *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x2e,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    local_c8 = (_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)CONCAT44(local_c8._4_4_,(uint)in_object);
    static_analysis((IdSet *)local_108,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)local_d8,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_108);
    uVar4 = ast_[1].location.begin.line;
    for (uVar23 = *(unsigned_long *)((long)&ast_[1].location.file.field_2 + 8); uVar23 != uVar4;
        uVar23 = uVar23 + 0x58) {
      static_analysis((IdSet *)local_108,*(AST **)(uVar23 + 0x38),SUB81(local_c8,0),vars);
      std::
      _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                  *)local_d8,
                 (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
                 (_Base_ptr)(local_108 + 8));
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   *)local_108);
    }
    break;
  case AST_APPLY_BRACE:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<ApplyBrace *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x35,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_ARRAY:
    local_c8 = &vars->_M_t;
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Array::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<Array *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x39,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    pp_Var9 = (_func_int **)ast_[1].location.file._M_dataplus._M_p;
    for (pp_Var25 = ast_[1]._vptr_AST; pp_Var25 != pp_Var9; pp_Var25 = pp_Var25 + 4) {
      static_analysis((IdSet *)local_108,(AST *)*pp_Var25,in_object,(IdSet *)local_c8);
      std::
      _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                  *)local_d8,
                 (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
                 (_Base_ptr)(local_108 + 8));
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   *)local_108);
    }
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ",0x1d);
    poVar15 = std::ostream::_M_insert<void_const*>(&std::cerr);
    std::endl<char,std::char_traits<char>>(poVar15);
    abort();
  case AST_BINARY:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Binary::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<Binary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x3f,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_108,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_108);
    static_analysis((IdSet *)local_108,(AST *)ast_[1].location.begin.line,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    goto LAB_001ab935;
  case AST_BUILTIN_FUNCTION:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<BuiltinFunction *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x45,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_CONDITIONAL:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Conditional::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<Conditional *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x49,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_108,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_108);
    static_analysis((IdSet *)local_108,*(AST **)((long)&ast_[1].location.file.field_2 + 8),in_object
                    ,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_108);
    static_analysis((IdSet *)local_108,(AST *)ast_[1].location.end.column,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    goto LAB_001ab935;
  case AST_DESUGARED_OBJECT:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&DesugaredObject::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<DesugaredObject *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xaa,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    pp_Var22 = (_Base_ptr *)ast_[1].location.file.field_2._M_allocated_capacity;
    local_c8 = *(_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 **)((long)&ast_[1].location.file.field_2 + 8);
    if ((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         *)pp_Var22 != local_c8) {
      do {
        static_analysis((IdSet *)local_108,*(AST **)&((_Rb_tree_header *)(pp_Var22 + 1))->_M_header,
                        in_object,vars);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                  ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)local_d8,
                   (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
                   (_Base_ptr)(local_108 + 8));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)local_108);
        static_analysis((IdSet *)local_108,(AST *)pp_Var22[2],true,vars);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                  ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)local_d8,
                   (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
                   (_Base_ptr)(local_108 + 8));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)local_108);
        pp_Var22 = pp_Var22 + 3;
      } while ((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)pp_Var22 != local_c8);
    }
    for (pAVar6 = (AST *)ast_[1]._vptr_AST; pAVar6 != ast_ + 1; pAVar6 = (AST *)pAVar6->_vptr_AST) {
      static_analysis((IdSet *)local_108,(AST *)(pAVar6->location).file._M_string_length,true,vars);
      std::
      _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                  *)local_d8,
                 (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
                 (_Base_ptr)(local_108 + 8));
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   *)local_108);
    }
    break;
  case AST_ERROR:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Error::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<Error *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x50,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_108,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    goto LAB_001ab935;
  case AST_FUNCTION:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Function::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<Function *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x55,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    local_cc = uVar18;
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_108,&vars->_M_t);
    p_Var3 = (_Base_ptr)(local_c0 + 8);
    local_c0._8_4_ = _S_red;
    local_c0._16_8_ = (_Base_ptr)0x0;
    local_98 = 0;
    sVar7 = *(size_type *)((long)&ast_[1].location.file.field_2 + 8);
    local_c0._24_8_ = p_Var3;
    local_a0 = p_Var3;
    for (sVar24 = ast_[1].location.file.field_2._M_allocated_capacity; sVar24 != sVar7;
        sVar24 = sVar24 + 0x58) {
      __v = (Identifier **)(sVar24 + 0x18);
      if ((_Base_ptr)local_c0._16_8_ != (_Base_ptr)0x0) {
        pIVar5 = *__v;
        p_Var12 = (_Base_ptr)local_c0._16_8_;
        p_Var20 = p_Var3;
        do {
          p_Var19 = p_Var20;
          p_Var17 = p_Var12;
          pIVar8 = *(Identifier **)(p_Var17 + 1);
          p_Var20 = p_Var17;
          if (pIVar8 < pIVar5) {
            p_Var20 = p_Var19;
          }
          p_Var12 = (&p_Var17->_M_left)[pIVar8 < pIVar5];
        } while ((&p_Var17->_M_left)[pIVar8 < pIVar5] != (_Base_ptr)0x0);
        if (p_Var20 != p_Var3) {
          if (pIVar8 < pIVar5) {
            p_Var17 = p_Var19;
          }
          if (*(Identifier **)(p_Var17 + 1) <= pIVar5) {
            encode_utf8((string *)local_90,(internal *)(pIVar5->name)._M_dataplus._M_p,
                        (UString *)(pIVar5->name)._M_string_length);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_60,"Duplicate function parameter: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90);
            if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
              operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
            }
            pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
            StaticError::StaticError(pSVar14,&ast_->location,(string *)local_60);
            __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
          }
        }
      }
      std::
      _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
      ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                  *)local_c0,__v);
      std::
      _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
      ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                  *)local_108,__v);
    }
    bVar10 = local_cc._0_1_;
    static_analysis((IdSet *)local_60,
                    (AST *)ast_[1].openFodder.
                           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           ._M_impl.super__Vector_impl_data._M_start,local_cc._0_1_,
                    (IdSet *)local_108);
    sVar24 = ast_[1].location.file.field_2._M_allocated_capacity;
    sVar7 = *(size_type *)((long)&ast_[1].location.file.field_2 + 8);
    if (sVar24 != sVar7) {
      do {
        if (*(AST **)(sVar24 + 0x38) != (AST *)0x0) {
          static_analysis((IdSet *)local_90,*(AST **)(sVar24 + 0x38),bVar10,(IdSet *)local_108);
          std::
          _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
          ::
          _M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                    ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                      *)local_60,
                     (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_90._24_8_
                     ,(_Base_ptr)(local_90 + 8));
          std::
          _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                       *)local_90);
        }
        sVar24 = sVar24 + 0x58;
      } while (sVar24 != sVar7);
      sVar24 = ast_[1].location.file.field_2._M_allocated_capacity;
      sVar7 = *(size_type *)((long)&ast_[1].location.file.field_2 + 8);
      if (sVar24 != sVar7) {
        do {
          pVar26 = std::
                   _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   ::equal_range((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                                  *)local_60,(key_type *)(sVar24 + 0x18));
          std::
          _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          ::_M_erase_aux((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                          *)local_60,(_Base_ptr)pVar26.first._M_node,
                         (_Base_ptr)pVar26.second._M_node);
          sVar24 = sVar24 + 0x58;
        } while (sVar24 != sVar7);
      }
    }
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)local_d8,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_60._24_8_,
               (_Base_ptr)(local_60 + 8));
    goto LAB_001ab91e;
  case AST_IMPORT:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Import::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<Import *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x6c,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_IMPORTSTR:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Importstr::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<Importstr *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x70,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_IMPORTBIN:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Importbin::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<Importbin *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x74,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_INDEX:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Index::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const Index *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x7f,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_108,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_108);
    static_analysis((IdSet *)local_108,(AST *)ast_[1].location.begin.line,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    goto LAB_001ab935;
  case AST_IN_SUPER:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&InSuper::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const InSuper *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x78,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    if (!in_object) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"Can\'t use super outside of an object.","");
      StaticError::StaticError(pSVar14,&ast_->location,(string *)local_108);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    static_analysis((IdSet *)local_108,(AST *)ast_[1]._vptr_AST,true,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    goto LAB_001ab935;
  case AST_LITERAL_BOOLEAN:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralBoolean::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const LiteralBoolean *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x9a,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_LITERAL_NULL:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNull::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const LiteralNull *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xa6,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_LITERAL_NUMBER:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNumber::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const LiteralNumber *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x9e,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_LITERAL_STRING:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralString::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const LiteralString *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xa2,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_LOCAL:
    local_cc = uVar18;
    local_c8 = &vars->_M_t;
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Local::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const Local *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x85,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    __last._M_node = (_Base_ptr)(local_108 + 8);
    local_108._8_4_ = _S_red;
    local_108._16_8_ = (_Base_ptr)0x0;
    local_e0 = 0;
    pp_Var9 = (_func_int **)ast_[1].location.file._M_dataplus._M_p;
    local_108._24_8_ = __last._M_node;
    local_e8 = __last._M_node;
    for (pp_Var25 = ast_[1]._vptr_AST; pp_Var25 != pp_Var9; pp_Var25 = pp_Var25 + 0x16) {
      std::
      _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
      ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                  *)local_108,(Identifier **)(pp_Var25 + 3));
    }
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_c0,local_c8);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)local_c0,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               __last);
    local_60._24_8_ = local_60 + 8;
    local_60._8_4_ = _S_red;
    local_60._16_8_ = (_Base_ptr)0x0;
    local_38 = 0;
    pp_Var25 = ast_[1]._vptr_AST;
    pp_Var9 = (_func_int **)ast_[1].location.file._M_dataplus._M_p;
    local_40 = (_Base_ptr)local_60._24_8_;
    if (pp_Var25 != pp_Var9) {
      bVar10 = local_cc._0_1_;
      do {
        static_analysis((IdSet *)local_90,(AST *)pp_Var25[7],bVar10,(IdSet *)local_c0);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                  ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)local_60,
                   (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_90._24_8_,
                   (_Base_ptr)(local_90 + 8));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)local_90);
        pp_Var25 = pp_Var25 + 0x16;
      } while (pp_Var25 != pp_Var9);
    }
    static_analysis((IdSet *)local_90,(AST *)ast_[1].location.file.field_2._M_allocated_capacity,
                    local_cc._0_1_,(IdSet *)local_c0);
    p_Var13 = local_d8;
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)local_60,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_90._24_8_,
               (_Base_ptr)(local_90 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_90);
    pp_Var25 = ast_[1]._vptr_AST;
    pp_Var9 = (_func_int **)ast_[1].location.file._M_dataplus._M_p;
    if (pp_Var25 != pp_Var9) {
      do {
        pVar26 = std::
                 _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 ::equal_range((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                                *)local_60,(key_type *)(pp_Var25 + 3));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::_M_erase_aux((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                        *)local_60,(_Base_ptr)pVar26.first._M_node,(_Base_ptr)pVar26.second._M_node)
        ;
        pp_Var25 = pp_Var25 + 0x16;
      } while (pp_Var25 != pp_Var9);
    }
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)p_Var13,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_60._24_8_,
               (_Base_ptr)(local_60 + 8));
LAB_001ab91e:
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_60);
LAB_001ab92b:
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_c0);
    goto LAB_001ab935;
  case AST_OBJECT_COMPREHENSION_SIMPLE:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehensionSimple *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xb5,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_108,&vars->_M_t);
    __v_00 = &ast_[1].location.file._M_string_length;
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)local_108,(Identifier **)__v_00);
    static_analysis((IdSet *)local_c0,(AST *)ast_[1]._vptr_AST,false,(IdSet *)local_108);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_c0._24_8_,
               (_Base_ptr)(local_c0 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_c0);
    static_analysis((IdSet *)local_c0,(AST *)ast_[1].location.file._M_dataplus._M_p,true,
                    (IdSet *)local_108);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_c0._24_8_,
               (_Base_ptr)(local_c0 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_c0);
    pVar26 = std::
             _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
             ::equal_range(&__return_storage_ptr__->_M_t,(key_type *)__v_00);
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::_M_erase_aux(&__return_storage_ptr__->_M_t,(_Base_ptr)pVar26.first._M_node,
                   (_Base_ptr)pVar26.second._M_node);
    static_analysis((IdSet *)local_c0,(AST *)ast_[1].location.file.field_2._M_allocated_capacity,
                    in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_c0._24_8_,
               (_Base_ptr)(local_c0 + 8));
    goto LAB_001ab92b;
  case AST_SELF:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Self::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const Self *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xbf,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    if (!in_object) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"Can\'t use self outside of an object.","");
      StaticError::StaticError(pSVar14,&ast_->location,(string *)local_108);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    break;
  case AST_SUPER_INDEX:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&SuperIndex::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const SuperIndex *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xc4,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    if (!in_object) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"Can\'t use super outside of an object.","");
      StaticError::StaticError(pSVar14,&ast_->location,(string *)local_108);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    static_analysis((IdSet *)local_108,(AST *)ast_[1].location.file.field_2._M_allocated_capacity,
                    true,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
    goto LAB_001ab935;
  case AST_UNARY:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Unary::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const Unary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xcb,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_108,(AST *)ast_[1].location.file._M_dataplus._M_p,in_object,vars)
    ;
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_108._24_8_,
               (_Base_ptr)(local_108 + 8));
LAB_001ab935:
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_108);
    break;
  case AST_VAR:
    lVar11 = __dynamic_cast(ast_,&AST::typeinfo,&Var::typeinfo,0);
    if (lVar11 == 0) {
      __assert_fail("dynamic_cast<const Var *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xd0,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    p_Var12 = (vars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var12 != (_Base_ptr)0x0) {
      p_Var21 = &(vars->_M_t)._M_impl.super__Rb_tree_header;
      pIVar5 = (Identifier *)ast_[1]._vptr_AST;
      p_Var16 = &p_Var21->_M_header;
      do {
        if (*(Identifier **)(p_Var12 + 1) >= pIVar5) {
          p_Var16 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[*(Identifier **)(p_Var12 + 1) < pIVar5];
      } while (p_Var12 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var16 != p_Var21) && (*(Identifier **)(p_Var16 + 1) <= pIVar5)) {
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                  ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)__return_storage_ptr__,(Identifier **)(ast_ + 1));
        break;
      }
    }
    pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
    encode_utf8((string *)local_c0,(internal *)*ast_[1]._vptr_AST,(UString *)ast_[1]._vptr_AST[1]);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "Unknown variable: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    StaticError::StaticError(pSVar14,&ast_->location,(string *)local_108);
    __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
  }
  p_Var13 = local_d8;
  if ((_Rb_tree_header *)local_d8->_M_right != p_Var1) {
    p_Var13 = local_d8->_M_right;
    do {
      local_108._0_8_ = *(undefined8 *)(p_Var13 + 1);
      __position._M_current =
           (ast_->freeVariables).
           super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (ast_->freeVariables).
          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_realloc_insert<jsonnet::internal::Identifier_const*const&>
                  ((vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)&ast_->freeVariables,__position,(Identifier **)local_108);
      }
      else {
        *__position._M_current = (Identifier *)local_108._0_8_;
        pppIVar2 = &(ast_->freeVariables).
                    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppIVar2 = *pppIVar2 + 1;
      }
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != p_Var1);
  }
  return (IdSet *)p_Var13;
}

Assistant:

static IdSet static_analysis(AST *ast_, bool in_object, const IdSet &vars)
{
    IdSet r;

    switch (ast_->type) {
    case AST_APPLY: {
        assert(dynamic_cast<Apply *>(ast_));
        auto* ast = static_cast<Apply *>(ast_);
        append(r, static_analysis(ast->target, in_object, vars));
        for (const auto &arg : ast->args)
            append(r, static_analysis(arg.expr, in_object, vars));
    } break;
    case AST_APPLY_BRACE: {
        assert(dynamic_cast<ApplyBrace *>(ast_));
        // Nothing to do.
    } break;
    case AST_ARRAY: {
        assert(dynamic_cast<Array *>(ast_));
        auto* ast = static_cast<Array *>(ast_);
        for (auto &el : ast->elements)
            append(r, static_analysis(el.expr, in_object, vars));
    } break;
    case AST_BINARY: {
        assert(dynamic_cast<Binary *>(ast_));
        auto* ast = static_cast<Binary *>(ast_);
        append(r, static_analysis(ast->left, in_object, vars));
        append(r, static_analysis(ast->right, in_object, vars));
    } break;
    case AST_BUILTIN_FUNCTION: {
        assert(dynamic_cast<BuiltinFunction *>(ast_));
        // Nothing to do.
    } break;
    case AST_CONDITIONAL: {
        assert(dynamic_cast<Conditional *>(ast_));
        auto* ast = static_cast<Conditional *>(ast_);
        append(r, static_analysis(ast->cond, in_object, vars));
        append(r, static_analysis(ast->branchTrue, in_object, vars));
        append(r, static_analysis(ast->branchFalse, in_object, vars));
    } break;
    case AST_ERROR: {
        assert(dynamic_cast<Error *>(ast_));
        auto* ast = static_cast<Error *>(ast_);
        append(r, static_analysis(ast->expr, in_object, vars));
    } break;
    case AST_FUNCTION: {
        assert(dynamic_cast<Function *>(ast_));
        auto* ast = static_cast<Function *>(ast_);
        auto new_vars = vars;
        IdSet params;
        for (const auto &p : ast->params) {
            if (params.find(p.id) != params.end()) {
                std::string msg = "Duplicate function parameter: " + encode_utf8(p.id->name);
                throw StaticError(ast_->location, msg);
            }
            params.insert(p.id);
            new_vars.insert(p.id);
        }

        auto fv = static_analysis(ast->body, in_object, new_vars);
        for (const auto &p : ast->params) {
            if (p.expr != nullptr)
                append(fv, static_analysis(p.expr, in_object, new_vars));
        }
        for (const auto &p : ast->params)
            fv.erase(p.id);
        append(r, fv);
    } break;
    case AST_IMPORT: {
        assert(dynamic_cast<Import *>(ast_));
        // Nothing to do.
    } break;
    case AST_IMPORTSTR: {
        assert(dynamic_cast<Importstr *>(ast_));
        // Nothing to do.
    } break;
    case AST_IMPORTBIN: {
        assert(dynamic_cast<Importbin *>(ast_));
        // Nothing to do.
    } break;
    case AST_IN_SUPER: {
        assert(dynamic_cast<const InSuper *>(ast_));
        auto* ast = static_cast<const InSuper *>(ast_);
        if (!in_object)
            throw StaticError(ast_->location, "Can't use super outside of an object.");
        append(r, static_analysis(ast->element, in_object, vars));
    } break;
    case AST_INDEX: {
        assert(dynamic_cast<const Index *>(ast_));
        auto* ast = static_cast<const Index *>(ast_);
        append(r, static_analysis(ast->target, in_object, vars));
        append(r, static_analysis(ast->index, in_object, vars));
    } break;
    case AST_LOCAL: {
        assert(dynamic_cast<const Local *>(ast_));
        auto* ast = static_cast<const Local *>(ast_);
        IdSet ast_vars;
        for (const auto &bind : ast->binds) {
            ast_vars.insert(bind.var);
        }
        auto new_vars = vars;
        append(new_vars, ast_vars);
        IdSet fvs;
        for (const auto &bind : ast->binds) {
            append(fvs, static_analysis(bind.body, in_object, new_vars));
        }

        append(fvs, static_analysis(ast->body, in_object, new_vars));

        for (const auto &bind : ast->binds)
            fvs.erase(bind.var);

        append(r, fvs);
    } break;
    case AST_LITERAL_BOOLEAN: {
        assert(dynamic_cast<const LiteralBoolean *>(ast_));
        // Nothing to do.
    } break;
    case AST_LITERAL_NUMBER: {
        assert(dynamic_cast<const LiteralNumber *>(ast_));
        // Nothing to do.
    } break;
    case AST_LITERAL_STRING: {
        assert(dynamic_cast<const LiteralString *>(ast_));
        // Nothing to do.
    } break;
    case AST_LITERAL_NULL: {
        assert(dynamic_cast<const LiteralNull *>(ast_));
        // Nothing to do.
    } break;
    case AST_DESUGARED_OBJECT: {
        assert(dynamic_cast<DesugaredObject *>(ast_));
        auto* ast = static_cast<DesugaredObject *>(ast_);
        for (auto &field : ast->fields) {
            append(r, static_analysis(field.name, in_object, vars));
            append(r, static_analysis(field.body, true, vars));
        }
        for (AST *assert : ast->asserts) {
            append(r, static_analysis(assert, true, vars));
        }
    } break;
    case AST_OBJECT_COMPREHENSION_SIMPLE: {
        assert(dynamic_cast<ObjectComprehensionSimple *>(ast_));
        auto* ast = static_cast<ObjectComprehensionSimple *>(ast_);
        auto new_vars = vars;
        new_vars.insert(ast->id);
        append(r, static_analysis(ast->field, false, new_vars));
        append(r, static_analysis(ast->value, true, new_vars));
        r.erase(ast->id);
        append(r, static_analysis(ast->array, in_object, vars));
    } break;
    case AST_SELF: {
        assert(dynamic_cast<const Self *>(ast_));
        if (!in_object)
            throw StaticError(ast_->location, "Can't use self outside of an object.");
    } break;
    case AST_SUPER_INDEX: {
        assert(dynamic_cast<const SuperIndex *>(ast_));
        auto* ast = static_cast<const SuperIndex *>(ast_);
        if (!in_object)
            throw StaticError(ast_->location, "Can't use super outside of an object.");
        append(r, static_analysis(ast->index, in_object, vars));
    } break;
    case AST_UNARY: {
        assert(dynamic_cast<const Unary *>(ast_));
        auto* ast = static_cast<const Unary *>(ast_);
        append(r, static_analysis(ast->expr, in_object, vars));
    } break;
    case AST_VAR: {
        assert(dynamic_cast<const Var *>(ast_));
        auto* ast = static_cast<const Var *>(ast_);
        if (vars.find(ast->id) == vars.end()) {
            throw StaticError(ast->location, "Unknown variable: " + encode_utf8(ast->id->name));
        }
        r.insert(ast->id);
    } break;
    default:
        std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
        std::abort();
        break;
    }

    for (auto *id : r)
        ast_->freeVariables.push_back(id);

    return r;
}